

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O0

void jinit_downsampler(j_compress_ptr cinfo)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined8 *puVar6;
  long *in_RDI;
  int v_out_group;
  int h_out_group;
  int v_in_group;
  int h_in_group;
  boolean smoothok;
  jpeg_component_info *compptr;
  int ci;
  my_downsample_ptr downsample;
  long local_20;
  int local_14;
  
  bVar3 = true;
  puVar6 = (undefined8 *)(**(code **)in_RDI[1])(in_RDI,1,0xa8);
  in_RDI[0x44] = (long)puVar6;
  *puVar6 = start_pass_downsample;
  puVar6[1] = sep_downsample;
  *(undefined4 *)(puVar6 + 2) = 0;
  if (*(int *)((long)in_RDI + 300) != 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x1a;
    (**(code **)*in_RDI)(in_RDI);
  }
  local_14 = 0;
  local_20 = in_RDI[0xd];
  for (; local_14 < *(int *)((long)in_RDI + 0x5c); local_14 = local_14 + 1) {
    iVar4 = (*(int *)(local_20 + 8) * *(int *)(local_20 + 0x24)) / *(int *)((long)in_RDI + 0x164);
    iVar5 = (*(int *)(local_20 + 0xc) * *(int *)(local_20 + 0x28)) / (int)in_RDI[0x2d];
    iVar1 = *(int *)((long)in_RDI + 0x15c);
    iVar2 = (int)in_RDI[0x2c];
    *(int *)((long)puVar6 + (long)local_14 * 4 + 0x68) = iVar5;
    if ((iVar1 == iVar4) && (iVar2 == iVar5)) {
      if (*(int *)((long)in_RDI + 0x134) == 0) {
        puVar6[(long)local_14 + 3] = fullsize_downsample;
      }
      else {
        puVar6[(long)local_14 + 3] = fullsize_smooth_downsample;
        *(undefined4 *)(puVar6 + 2) = 1;
      }
    }
    else if ((iVar1 == iVar4 * 2) && (iVar2 == iVar5)) {
      bVar3 = false;
      puVar6[(long)local_14 + 3] = h2v1_downsample;
    }
    else if ((iVar1 == iVar4 * 2) && (iVar2 == iVar5 * 2)) {
      if (*(int *)((long)in_RDI + 0x134) == 0) {
        puVar6[(long)local_14 + 3] = h2v2_downsample;
      }
      else {
        puVar6[(long)local_14 + 3] = h2v2_smooth_downsample;
        *(undefined4 *)(puVar6 + 2) = 1;
      }
    }
    else if ((iVar1 % iVar4 == 0) && (iVar2 % iVar5 == 0)) {
      bVar3 = false;
      puVar6[(long)local_14 + 3] = int_downsample;
      *(char *)((long)puVar6 + (long)local_14 + 0x90) = (char)(iVar1 / iVar4);
      *(char *)((long)puVar6 + (long)local_14 + 0x9a) = (char)(iVar2 / iVar5);
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x27;
      (**(code **)*in_RDI)(in_RDI);
    }
    local_20 = local_20 + 0x60;
  }
  if ((*(int *)((long)in_RDI + 0x134) != 0) && (!bVar3)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x65;
    (**(code **)(*in_RDI + 8))(in_RDI,0);
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_downsampler (j_compress_ptr cinfo)
{
  my_downsample_ptr downsample;
  int ci;
  jpeg_component_info * compptr;
  boolean smoothok = TRUE;
  int h_in_group, v_in_group, h_out_group, v_out_group;

  downsample = (my_downsample_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_downsampler));
  cinfo->downsample = (struct jpeg_downsampler *) downsample;
  downsample->pub.start_pass = start_pass_downsample;
  downsample->pub.downsample = sep_downsample;
  downsample->pub.need_context_rows = FALSE;

  if (cinfo->CCIR601_sampling)
    ERREXIT(cinfo, JERR_CCIR601_NOTIMPL);

  /* Verify we can handle the sampling factors, and set up method pointers */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Compute size of an "output group" for DCT scaling.  This many samples
     * are to be converted from max_h_samp_factor * max_v_samp_factor pixels.
     */
    h_out_group = (compptr->h_samp_factor * compptr->DCT_h_scaled_size) /
		  cinfo->min_DCT_h_scaled_size;
    v_out_group = (compptr->v_samp_factor * compptr->DCT_v_scaled_size) /
		  cinfo->min_DCT_v_scaled_size;
    h_in_group = cinfo->max_h_samp_factor;
    v_in_group = cinfo->max_v_samp_factor;
    downsample->rowgroup_height[ci] = v_out_group; /* save for use later */
    if (h_in_group == h_out_group && v_in_group == v_out_group) {
#ifdef INPUT_SMOOTHING_SUPPORTED
      if (cinfo->smoothing_factor) {
	downsample->methods[ci] = fullsize_smooth_downsample;
	downsample->pub.need_context_rows = TRUE;
      } else
#endif
	downsample->methods[ci] = fullsize_downsample;
    } else if (h_in_group == h_out_group * 2 &&
	       v_in_group == v_out_group) {
      smoothok = FALSE;
      downsample->methods[ci] = h2v1_downsample;
    } else if (h_in_group == h_out_group * 2 &&
	       v_in_group == v_out_group * 2) {
#ifdef INPUT_SMOOTHING_SUPPORTED
      if (cinfo->smoothing_factor) {
	downsample->methods[ci] = h2v2_smooth_downsample;
	downsample->pub.need_context_rows = TRUE;
      } else
#endif
	downsample->methods[ci] = h2v2_downsample;
    } else if ((h_in_group % h_out_group) == 0 &&
	       (v_in_group % v_out_group) == 0) {
      smoothok = FALSE;
      downsample->methods[ci] = int_downsample;
      downsample->h_expand[ci] = (UINT8) (h_in_group / h_out_group);
      downsample->v_expand[ci] = (UINT8) (v_in_group / v_out_group);
    } else
      ERREXIT(cinfo, JERR_FRACT_SAMPLE_NOTIMPL);
  }

#ifdef INPUT_SMOOTHING_SUPPORTED
  if (cinfo->smoothing_factor && !smoothok)
    TRACEMS(cinfo, 0, JTRC_SMOOTH_NOTIMPL);
#endif
}